

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O0

IOStream * __thiscall
Assimp::ZipArchiveIOSystem::Implement::OpenFile(Implement *this,string *filename)

{
  bool bVar1;
  reference ppVar2;
  ZipFileInfo *zip_file;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>_>
  local_28;
  const_iterator zip_it;
  string *filename_local;
  Implement *this_local;
  
  zip_it._M_node = (_Base_ptr)filename;
  MapArchive(this);
  SimplifyFilename((string *)zip_it._M_node);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>_>_>
       ::find(&this->m_ArchiveMap,zip_it._M_node);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>_>
  ::_Rb_tree_const_iterator(&local_28,&local_30);
  zip_file = (ZipFileInfo *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>_>_>
             ::cend(&this->m_ArchiveMap);
  bVar1 = std::operator==(&local_28,(_Self *)&zip_file);
  if (bVar1) {
    this_local = (Implement *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>_>
             ::operator*(&local_28);
    this_local = (Implement *)ZipFileInfo::Extract(&ppVar2->second,this->m_ZipFileHandle);
  }
  return (IOStream *)this_local;
}

Assistant:

IOStream * ZipArchiveIOSystem::Implement::OpenFile(std::string& filename) {
        MapArchive();

        SimplifyFilename(filename);

        // Find in the map
        ZipFileInfoMap::const_iterator zip_it = m_ArchiveMap.find(filename);
        if (zip_it == m_ArchiveMap.cend())
            return nullptr;

        const ZipFileInfo &zip_file = (*zip_it).second;
        return zip_file.Extract(m_ZipFileHandle);
    }